

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::
      SelectGenericLoop<unsigned_long,unsigned_long,duckdb::GreaterThanEquals,true,false,true>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *lsel,
                SelectionVector *rsel,SelectionVector *result_sel,idx_t count,
                ValidityMask *lvalidity,ValidityMask *rvalidity,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  ulong uVar1;
  idx_t i;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  lVar3 = 0;
  for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar2;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar1 = (ulong)result_sel->sel_vector[uVar2];
    }
    uVar4 = uVar2;
    if (lsel->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)lsel->sel_vector[uVar2];
    }
    uVar5 = uVar2;
    if (rsel->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)rsel->sel_vector[uVar2];
    }
    if (ldata[uVar4] < rdata[uVar5]) {
      false_sel->sel_vector[lVar3] = (sel_t)uVar1;
      lVar3 = lVar3 + 1;
    }
  }
  return count - lVar3;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}